

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O2

void Curl_wildcard_dtor(WildcardData *wc)

{
  if (wc != (WildcardData *)0x0) {
    if (wc->dtor != (curl_wildcard_dtor)0x0) {
      (*wc->dtor)(wc->protdata);
      wc->protdata = (void *)0x0;
      wc->dtor = (curl_wildcard_dtor)0x0;
    }
    Curl_llist_destroy(&wc->filelist,(void *)0x0);
    (*Curl_cfree)(wc->path);
    wc->path = (char *)0x0;
    (*Curl_cfree)(wc->pattern);
    wc->pattern = (char *)0x0;
    wc->customptr = (void *)0x0;
    wc->state = CURLWC_INIT;
  }
  return;
}

Assistant:

void Curl_wildcard_dtor(struct WildcardData *wc)
{
  if(!wc)
    return;

  if(wc->dtor) {
    wc->dtor(wc->protdata);
    wc->dtor = ZERO_NULL;
    wc->protdata = NULL;
  }
  DEBUGASSERT(wc->protdata == NULL);

  Curl_llist_destroy(&wc->filelist, NULL);


  free(wc->path);
  wc->path = NULL;
  free(wc->pattern);
  wc->pattern = NULL;

  wc->customptr = NULL;
  wc->state = CURLWC_INIT;
}